

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonparser.cpp
# Opt level: O2

bool json_parse(uint8_t *buf,size_t len,ParsedJson *pj,bool reallocifneeded)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  uint8_t *__dest;
  
  if (pj->bytecapacity < len) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Your ParsedJson cannot support documents that big: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    if (reallocifneeded) {
      uVar4 = sysconf(0x1e);
      bVar1 = false;
      if ((ulong)(buf + (len - 1)) % uVar4 < 0x20) {
        __dest = (uint8_t *)allocate_padded_buffer(len);
        if (__dest == (uint8_t *)0x0) {
          return false;
        }
        memcpy(__dest,buf,len);
        bVar1 = true;
        buf = __dest;
      }
    }
    else {
      bVar1 = false;
    }
    bVar2 = find_structural_bits(buf,len,pj);
    if (bVar2) {
      bVar2 = unified_machine(buf,len,pj);
      if (bVar1) {
        free(buf);
        return bVar2;
      }
      return bVar2;
    }
    if (bVar1) {
      free(buf);
    }
  }
  return false;
}

Assistant:

WARN_UNUSED
bool json_parse(const uint8_t *buf, size_t len, ParsedJson &pj, bool reallocifneeded) {
  if (pj.bytecapacity < len) {
    std::cerr << "Your ParsedJson cannot support documents that big: " << len
              << std::endl;
    return false;
  }
  bool reallocated = false;
  if(reallocifneeded) {
      // realloc is needed if the end of the memory crosses a page
#ifdef _MSC_VER
	  SYSTEM_INFO sysInfo; 
	  GetSystemInfo(&sysInfo); 
	  long pagesize = sysInfo.dwPageSize;
#else
     long pagesize = sysconf (_SC_PAGESIZE); 
#endif
	 if ( (reinterpret_cast<uintptr_t>(buf + len - 1) % pagesize ) < SIMDJSON_PADDING ) {
       const uint8_t *tmpbuf  = buf;
       buf = reinterpret_cast<uint8_t *>(allocate_padded_buffer(len));
       if(buf == nullptr) { return false;
}
       memcpy((void*)buf,tmpbuf,len);
       reallocated = true;
     }
  }
  bool isok = find_structural_bits(buf, len, pj);
  if (isok) {
    isok = unified_machine(buf, len, pj);
  } else {
    if(reallocated) { aligned_free((void*)buf);
}
    return false;
  }
  if(reallocated) { aligned_free((void*)buf);
}
  return isok;
}